

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

int PAL_iswxdigit(char16_t c)

{
  uint uVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (9 < (ushort)(c + L'￐')) {
    uVar1 = (ushort)c - 0x41;
    if ((((0x25 < uVar1) || ((0x3f0000003fU >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
        (9 < (ushort)(c + L'ð'))) &&
       ((uVar1 = (ushort)c - 0xff21, 0x25 < uVar1 ||
        ((0x3f0000003fU >> ((ulong)uVar1 & 0x3f) & 1) == 0)))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int
__cdecl
PAL_iswxdigit( char16_t c )
{
    UINT nRetVal = 0;

    PERF_ENTRY(iswxdigit);
    ENTRY("PAL_iswxdigit( c=%d )\n", c);

    /* ASCII characters */
    if((c>= 'A' && c<='F') ||        /* uppercase hex letters */
       (c>= 'a' && c<='f') ||        /* lowercase hex letters */
       (c>= '0' && c<='9'))          /* digits */
    {
        nRetVal = 1;
    }
    else
    /* "fullwidth" characters, whatever that is */
    if((c>= 0xFF10 && c<=0xFF19) ||  /* digits */
       (c>= 0xFF21 && c<=0xFF26) ||  /* uppercase hex letters */
       (c>= 0xFF41 && c<=0xFF46))    /* lowercase hex letters */
    {
        nRetVal = 1;
    }
    else
    {
        nRetVal = 0;
    }
    LOGEXIT("PAL_iswxdigit returning %d\n", nRetVal);
    PERF_EXIT(iswxdigit);
    return nRetVal;
}